

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yamc_barrier.hpp
# Opt level: O0

void __thiscall
yamc::barrier<yamc::detail::default_barrier_completion>::arrive_and_wait
          (barrier<yamc::detail::default_barrier_completion> *this)

{
  uint uVar1;
  undefined1 local_20 [4];
  uint arrival_phase;
  unique_lock<std::mutex> lk;
  barrier<yamc::detail::default_barrier_completion> *this_local;
  
  lk._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->mtx_);
  if (this->counter_ < 1) {
    __assert_fail("0 < counter_",
                  "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/include/yamc_barrier.hpp"
                  ,0x80,
                  "void yamc::barrier<>::arrive_and_wait() [CompletionFunction = yamc::detail::default_barrier_completion]"
                 );
  }
  uVar1 = this->phase_;
  this->counter_ = this->counter_ + -1;
  if (this->counter_ == 0) {
    phase_completion_step(this,false);
  }
  while (this->phase_ <= uVar1) {
    std::condition_variable::wait((unique_lock *)&this->cv_);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return;
}

Assistant:

void arrive_and_wait()
  {
    // equivalent to wait(arrive())
    std::unique_lock<decltype(mtx_)> lk(mtx_);
    assert(0 < counter_);
    auto arrival_phase = phase_;
    counter_ -= 1;
    if (counter_ == 0) {
      phase_completion_step(false);
    }
    while (phase_ <= arrival_phase) {
      cv_.wait(lk);
    }
  }